

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O2

vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_> *
ExprEval::Operator::get_custom_table(void)

{
  allocator local_161;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  CustomOperator operator_id;
  CustomOperator operator_sqrt;
  
  if (custom_operator_table ==
      (vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
       *)0x0) {
    custom_operator_table =
         (vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
          *)operator_new(0x18);
    (custom_operator_table->
    super__Vector_base<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    operator_sqrt.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__CustomOperator_00114ce8;
    operator_sqrt.symbol._M_dataplus._M_p = (pointer)&operator_sqrt.symbol.field_2;
    operator_sqrt.symbol._M_string_length = 0;
    (custom_operator_table->
    super__Vector_base<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (custom_operator_table->
    super__Vector_base<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    operator_sqrt.symbol.field_2._M_local_buf[0] = '\0';
    operator_sqrt.expression._M_dataplus._M_p = (pointer)&operator_sqrt.expression.field_2;
    operator_sqrt.variables.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    operator_sqrt.variables.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    operator_sqrt.variables.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    operator_sqrt.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    operator_sqrt.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    operator_sqrt.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    operator_sqrt.expression._M_string_length = 0;
    operator_sqrt.expression.field_2._M_local_buf[0] = '\0';
    operator_sqrt.result._M_dataplus._M_p = (pointer)&operator_sqrt.result.field_2;
    operator_sqrt.result._M_string_length = 0;
    operator_sqrt.result.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::assign((char *)&operator_sqrt.symbol);
    std::__cxx11::string::string((string *)&operator_id,"var",(allocator *)&local_160);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &operator_sqrt.variables,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&operator_id);
    std::__cxx11::string::~string((string *)&operator_id);
    operator_id.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&operator_sqrt.arg_positions,(int *)&operator_id);
    std::__cxx11::string::assign((char *)&operator_sqrt.expression);
    operator_id.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__CustomOperator_00114ce8;
    operator_id.symbol._M_dataplus._M_p = (pointer)&operator_id.symbol.field_2;
    operator_id.symbol._M_string_length = 0;
    operator_id.symbol.field_2._M_local_buf[0] = '\0';
    operator_id.expression._M_dataplus._M_p = (pointer)&operator_id.expression.field_2;
    operator_id.variables.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    operator_id.variables.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    operator_id.variables.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    operator_id.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    operator_id.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    operator_id.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    operator_id.expression._M_string_length = 0;
    operator_id.expression.field_2._M_local_buf[0] = '\0';
    operator_id.result._M_dataplus._M_p = (pointer)&operator_id.result.field_2;
    operator_id.result._M_string_length = 0;
    operator_id.result.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::assign((char *)&operator_id.symbol);
    std::__cxx11::string::string((string *)&local_160,"x",&local_161);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &operator_id.variables,&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    local_160._M_dataplus._M_p._0_4_ = 1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&operator_id.arg_positions,(int *)&local_160);
    std::__cxx11::string::assign((char *)&operator_id.expression);
    std::
    vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
    ::push_back(custom_operator_table,&operator_sqrt);
    std::
    vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
    ::push_back(custom_operator_table,&operator_id);
    CustomOperator::~CustomOperator(&operator_id);
    CustomOperator::~CustomOperator(&operator_sqrt);
  }
  return custom_operator_table;
}

Assistant:

const std::vector<Operator::CustomOperator>* get_custom_table(){
            if(!custom_operator_table){
                custom_operator_table = new std::vector<Operator::CustomOperator>;

                CustomOperator operator_sqrt;
                operator_sqrt.symbol = "sqrt";
                operator_sqrt.variables.push_back("var");
                operator_sqrt.arg_positions.push_back(1);
                operator_sqrt.expression = "var^0.5";

                CustomOperator operator_id;
                operator_id.symbol = "id";
                operator_id.variables.push_back("x");
                operator_id.arg_positions.push_back(1);
                operator_id.expression = "x";

                custom_operator_table->push_back(operator_sqrt);
                custom_operator_table->push_back(operator_id);
            }
            return custom_operator_table;
        }